

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O2

VariableIndex __thiscall
dynet::ComputationGraph::
add_function<dynet::HingeDim,std::vector<unsigned_int,std::allocator<unsigned_int>>const*&,unsigned_int&,float&>
          (ComputationGraph *this,initializer_list<unsigned_int> *arguments,
          vector<unsigned_int,_std::allocator<unsigned_int>_> **side_information,
          uint *side_information_1,float *side_information_2)

{
  Node *pNVar1;
  HingeDim *this_00;
  Device **ppDVar2;
  VariableIndex new_node_index;
  VariableIndex local_3c;
  HingeDim *local_38;
  
  local_3c = (VariableIndex)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  this_00 = (HingeDim *)operator_new(0xb0);
  HingeDim::HingeDim(this_00,arguments,*side_information,*side_information_1,*side_information_2);
  local_38 = this_00;
  std::vector<dynet::Node*,std::allocator<dynet::Node*>>::emplace_back<dynet::Node*>
            ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,(Node **)&local_38);
  pNVar1 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  if (pNVar1->device == (Device *)0x0) {
    if (arguments->_M_len == 0) {
      ppDVar2 = (Device **)&dynet::default_device;
    }
    else {
      ppDVar2 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[*arguments->_M_array]->device;
    }
    pNVar1->device = *ppDVar2;
  }
  set_dim_for_new_node(this,&local_3c);
  return local_3c;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
    Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  if (nodes.back()->device == nullptr) {
    if (arguments.size()) {
      nodes.back()->device = nodes[*arguments.begin()]->device;
    } else {
      nodes.back()->device = dynet::default_device;
    }
  }
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}